

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# candump.c
# Opt level: O0

void print_usage(void)

{
  fprintf(_stderr,"%s - dump CAN bus traffic.\n",progname);
  fprintf(_stderr,"\nUsage: %s [options] <CAN interface>+\n",progname);
  fprintf(_stderr,"  (use CTRL-C to terminate %s)\n\n",progname);
  fprintf(_stderr,"Options:\n");
  fprintf(_stderr,"         -t <type>   (timestamp: (a)bsolute/(d)elta/(z)ero/(A)bsolute w date)\n")
  ;
  fprintf(_stderr,"         -H          (read hardware timestamps instead of system timestamps)\n");
  fprintf(_stderr,"         -c          (increment color mode level)\n");
  fprintf(_stderr,"         -i          (binary output - may exceed 80 chars/line)\n");
  fprintf(_stderr,"         -a          (enable additional ASCII output)\n");
  fprintf(_stderr,
          "         -S          (swap byte order in printed CAN data[] - marked with \'%c\' )\n",
          0x60);
  fprintf(_stderr,
          "         -s <level>  (silent mode - %d: off (default) %d: animation %d: silent)\n",0,1,2)
  ;
  fprintf(_stderr,"         -l          (log CAN-frames into file. Sets \'-s %d\' by default)\n",2);
  fprintf(_stderr,
          "         -f <fname>  (log CAN-frames into file <fname>. Sets \'-s %d\' by default)\n",2);
  fprintf(_stderr,"         -L          (use log file format on stdout)\n");
  fprintf(_stderr,"         -n <count>  (terminate after reception of <count> CAN frames)\n");
  fprintf(_stderr,"         -r <size>   (set socket receive buffer to <size>)\n");
  fprintf(_stderr,"         -D          (Don\'t exit if a \"detected\" can device goes down)\n");
  fprintf(_stderr,"         -d          (monitor dropped CAN frames)\n");
  fprintf(_stderr,"         -e          (dump CAN error frames in human-readable format)\n");
  fprintf(_stderr,"         -8          (display raw DLC values in {} for Classical CAN)\n");
  fprintf(_stderr,"         -x          (print extra message infos, rx/tx brs esi)\n");
  fprintf(_stderr,"         -T <msecs>  (terminate after <msecs> if no frames were received)\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"Up to %d CAN interfaces with optional filter sets can be specified\n",0x10);
  fprintf(_stderr,"on the commandline in the form: <ifname>[,filter]*\n");
  fprintf(_stderr,"\nFilters:\n");
  fprintf(_stderr,"  Comma separated filters can be specified for each given CAN interface:\n");
  fprintf(_stderr,
          "    <can_id>:<can_mask>\n         (matches when <received_can_id> & mask == can_id & mask)\n"
         );
  fprintf(_stderr,
          "    <can_id>~<can_mask>\n         (matches when <received_can_id> & mask != can_id & mask)\n"
         );
  fprintf(_stderr,
          "    #<error_mask>\n         (set error frame filter, see include/linux/can/error.h)\n");
  fprintf(_stderr,"    [j|J]\n         (join the given CAN filters - logical AND semantic)\n");
  fprintf(_stderr,
          "\nCAN IDs, masks and data content are given and expected in hexadecimal values.\n");
  fprintf(_stderr,
          "When the can_id is 8 digits long the CAN_EFF_FLAG is set for 29 bit EFF format.\n");
  fprintf(_stderr,
          "Without any given filter all data frames are received (\'0:0\' default filter).\n");
  fprintf(_stderr,"\nUse interface name \'%s\' to receive from all CAN interfaces.\n","any");
  fprintf(_stderr,"\nExamples:\n");
  fprintf(_stderr,"%s -c -c -ta can0,123:7FF,400:700,#000000FF can2,400~7F0 can3 can8\n\n",progname)
  ;
  fprintf(_stderr,
          "%s -l any,0~0,#FFFFFFFF\n         (log only error frames but no(!) data frames)\n",
          progname);
  fprintf(_stderr,"%s -l any,0:0,#FFFFFFFF\n         (log error frames and also all data frames)\n",
          progname);
  fprintf(_stderr,"%s vcan2,12345678:DFFFFFFF\n         (match only for extended CAN ID 12345678)\n"
          ,progname);
  fprintf(_stderr,"%s vcan2,123:7FF\n         (matches CAN ID 123 - including EFF and RTR frames)\n"
          ,progname);
  fprintf(_stderr,
          "%s vcan2,123:C00007FF\n         (matches CAN ID 123 - only SFF and non-RTR frames)\n",
          progname);
  fprintf(_stderr,"\n");
  return;
}

Assistant:

static void print_usage(void)
{
	fprintf(stderr, "%s - dump CAN bus traffic.\n", progname);
	fprintf(stderr, "\nUsage: %s [options] <CAN interface>+\n", progname);
	fprintf(stderr, "  (use CTRL-C to terminate %s)\n\n", progname);
	fprintf(stderr, "Options:\n");
	fprintf(stderr, "         -t <type>   (timestamp: (a)bsolute/(d)elta/(z)ero/(A)bsolute w date)\n");
	fprintf(stderr, "         -H          (read hardware timestamps instead of system timestamps)\n");
	fprintf(stderr, "         -c          (increment color mode level)\n");
	fprintf(stderr, "         -i          (binary output - may exceed 80 chars/line)\n");
	fprintf(stderr, "         -a          (enable additional ASCII output)\n");
	fprintf(stderr, "         -S          (swap byte order in printed CAN data[] - marked with '%c' )\n", SWAP_DELIMITER);
	fprintf(stderr, "         -s <level>  (silent mode - %d: off (default) %d: animation %d: silent)\n", SILENT_OFF, SILENT_ANI, SILENT_ON);
	fprintf(stderr, "         -l          (log CAN-frames into file. Sets '-s %d' by default)\n", SILENT_ON);
	fprintf(stderr, "         -f <fname>  (log CAN-frames into file <fname>. Sets '-s %d' by default)\n", SILENT_ON);
	fprintf(stderr, "         -L          (use log file format on stdout)\n");
	fprintf(stderr, "         -n <count>  (terminate after reception of <count> CAN frames)\n");
	fprintf(stderr, "         -r <size>   (set socket receive buffer to <size>)\n");
	fprintf(stderr, "         -D          (Don't exit if a \"detected\" can device goes down)\n");
	fprintf(stderr, "         -d          (monitor dropped CAN frames)\n");
	fprintf(stderr, "         -e          (dump CAN error frames in human-readable format)\n");
	fprintf(stderr, "         -8          (display raw DLC values in {} for Classical CAN)\n");
	fprintf(stderr, "         -x          (print extra message infos, rx/tx brs esi)\n");
	fprintf(stderr, "         -T <msecs>  (terminate after <msecs> if no frames were received)\n");
	fprintf(stderr, "\n");
	fprintf(stderr, "Up to %d CAN interfaces with optional filter sets can be specified\n", MAXSOCK);
	fprintf(stderr, "on the commandline in the form: <ifname>[,filter]*\n");
	fprintf(stderr, "\nFilters:\n");
	fprintf(stderr, "  Comma separated filters can be specified for each given CAN interface:\n");
	fprintf(stderr, "    <can_id>:<can_mask>\n         (matches when <received_can_id> & mask == can_id & mask)\n");
	fprintf(stderr, "    <can_id>~<can_mask>\n         (matches when <received_can_id> & mask != can_id & mask)\n");
	fprintf(stderr, "    #<error_mask>\n         (set error frame filter, see include/linux/can/error.h)\n");
	fprintf(stderr, "    [j|J]\n         (join the given CAN filters - logical AND semantic)\n");
	fprintf(stderr, "\nCAN IDs, masks and data content are given and expected in hexadecimal values.\n");
	fprintf(stderr, "When the can_id is 8 digits long the CAN_EFF_FLAG is set for 29 bit EFF format.\n");
	fprintf(stderr, "Without any given filter all data frames are received ('0:0' default filter).\n");
	fprintf(stderr, "\nUse interface name '%s' to receive from all CAN interfaces.\n", ANYDEV);
	fprintf(stderr, "\nExamples:\n");
	fprintf(stderr, "%s -c -c -ta can0,123:7FF,400:700,#000000FF can2,400~7F0 can3 can8\n\n", progname);
	fprintf(stderr, "%s -l any,0~0,#FFFFFFFF\n         (log only error frames but no(!) data frames)\n", progname);
	fprintf(stderr, "%s -l any,0:0,#FFFFFFFF\n         (log error frames and also all data frames)\n", progname);
	fprintf(stderr, "%s vcan2,12345678:DFFFFFFF\n         (match only for extended CAN ID 12345678)\n", progname);
	fprintf(stderr, "%s vcan2,123:7FF\n         (matches CAN ID 123 - including EFF and RTR frames)\n", progname);
	fprintf(stderr, "%s vcan2,123:C00007FF\n         (matches CAN ID 123 - only SFF and non-RTR frames)\n", progname);
	fprintf(stderr, "\n");
}